

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtptcptransmitter.cpp
# Opt level: O1

void __thiscall jrtplib::RTPTCPTransmitter::ClearDestinations(RTPTCPTransmitter *this)

{
  _Base_ptr p_Var1;
  RTPMemoryManager *pRVar2;
  _Rb_tree_node_base *p_Var3;
  
  if ((this->m_init == true) && (this->m_created == true)) {
    for (p_Var3 = (this->m_destSockets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var3 != &(this->m_destSockets)._M_t._M_impl.super__Rb_tree_header;
        p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
      p_Var1 = p_Var3[1]._M_right;
      p_Var3[1]._M_right = (_Base_ptr)0x0;
      if (p_Var1 != (_Base_ptr)0x0) {
        pRVar2 = (this->super_RTPTransmitter).super_RTPMemoryObject.mgr;
        if (pRVar2 == (RTPMemoryManager *)0x0) {
          operator_delete__(p_Var1);
        }
        else {
          (**(code **)(*(long *)pRVar2 + 0x18))();
        }
      }
    }
    std::
    _Rb_tree<int,_std::pair<const_int,_jrtplib::RTPTCPTransmitter::SocketData>,_std::_Select1st<std::pair<const_int,_jrtplib::RTPTCPTransmitter::SocketData>_>,_std::less<int>,_std::allocator<std::pair<const_int,_jrtplib::RTPTCPTransmitter::SocketData>_>_>
    ::clear(&(this->m_destSockets)._M_t);
    return;
  }
  return;
}

Assistant:

void RTPTCPTransmitter::ClearDestinations()
{
	if (!m_init)
		return;
	
	MAINMUTEX_LOCK
	if (m_created)
		ClearDestSockets();
	MAINMUTEX_UNLOCK
}